

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcalc.c
# Opt level: O0

FT_UInt32 FT_Vector_NormLen(FT_Vector *vector)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong local_60;
  ulong local_58;
  int local_50;
  uint local_4c;
  int local_44;
  FT_Int shift;
  FT_Int sy;
  FT_Int sx;
  FT_UInt32 l;
  FT_UInt32 v;
  FT_UInt32 u;
  FT_UInt32 y;
  FT_UInt32 x;
  FT_Int32 z;
  FT_Int32 b;
  FT_Int32 y_;
  FT_Int32 x_;
  FT_Vector *vector_local;
  
  u = (FT_UInt32)vector->x;
  v = (FT_UInt32)vector->y;
  shift = 1;
  local_44 = 1;
  if ((int)u < 0) {
    u = -u;
    shift = -1;
  }
  if ((int)v < 0) {
    v = -v;
    local_44 = -1;
  }
  if (u == 0) {
    if (v != 0) {
      vector->y = (long)(local_44 << 0x10);
    }
    vector_local._4_4_ = v;
  }
  else if (v == 0) {
    if (u != 0) {
      vector->x = (long)(shift << 0x10);
    }
    vector_local._4_4_ = u;
  }
  else {
    if (v < u) {
      local_4c = u + (v >> 1);
    }
    else {
      local_4c = v + (u >> 1);
    }
    uVar3 = 0x1f;
    if (local_4c != 0) {
      for (; local_4c >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    iVar2 = 0x1f - (0x1f - (uVar3 ^ 0x1f));
    iVar2 = iVar2 - ((0xaaaaaaaaUL >> ((byte)iVar2 & 0x3f) <= (ulong)local_4c) + 0xf);
    bVar1 = (byte)iVar2;
    if (iVar2 < 1) {
      u = u >> (-bVar1 & 0x1f);
      v = v >> (-bVar1 & 0x1f);
      sy = local_4c >> (-bVar1 & 0x1f);
    }
    else {
      u = u << (bVar1 & 0x1f);
      v = v << (bVar1 & 0x1f);
      if (v < u) {
        local_50 = u + (v >> 1);
      }
      else {
        local_50 = v + (u >> 1);
      }
      sy = local_50;
    }
    x = 0x10000 - sy;
    do {
      uVar3 = u + ((int)(u * x) >> 0x10);
      uVar4 = v + ((int)(v * x) >> 0x10);
      iVar5 = (((int)-(uVar3 * uVar3 + uVar4 * uVar4) / 0x200) * ((int)(x + 0x10000) >> 8)) /
              0x10000;
      x = iVar5 + x;
    } while (0 < iVar5);
    if (shift < 0) {
      local_58 = -(ulong)uVar3;
    }
    else {
      local_58 = (ulong)uVar3;
    }
    vector->x = local_58;
    if (local_44 < 0) {
      local_60 = -(ulong)uVar4;
    }
    else {
      local_60 = (ulong)uVar4;
    }
    vector->y = local_60;
    iVar5 = (int)(uVar3 * u + uVar4 * v) / 0x10000 + 0x10000;
    if (iVar2 < 1) {
      sy = iVar5 << (-bVar1 & 0x1f);
    }
    else {
      sy = (uint)(iVar5 + (1 << (bVar1 - 1 & 0x1f))) >> (bVar1 & 0x1f);
    }
    vector_local._4_4_ = sy;
  }
  return vector_local._4_4_;
}

Assistant:

FT_BASE_DEF( FT_UInt32 )
  FT_Vector_NormLen( FT_Vector*  vector )
  {
    FT_Int32   x_ = vector->x;
    FT_Int32   y_ = vector->y;
    FT_Int32   b, z;
    FT_UInt32  x, y, u, v, l;
    FT_Int     sx = 1, sy = 1, shift;


    x = (FT_UInt32)x_;
    y = (FT_UInt32)y_;

    FT_MOVE_SIGN( x_, x, sx );
    FT_MOVE_SIGN( y_, y, sy );

    /* trivial cases */
    if ( x == 0 )
    {
      if ( y > 0 )
        vector->y = sy * 0x10000;
      return y;
    }
    else if ( y == 0 )
    {
      if ( x > 0 )
        vector->x = sx * 0x10000;
      return x;
    }

    /* Estimate length and prenormalize by shifting so that */
    /* the new approximate length is between 2/3 and 4/3.   */
    /* The magic constant 0xAAAAAAAAUL (2/3 of 2^32) helps  */
    /* achieve this in 16.16 fixed-point representation.    */
    l = x > y ? x + ( y >> 1 )
              : y + ( x >> 1 );

    shift  = 31 - FT_MSB( l );
    shift -= 15 + ( l >= ( 0xAAAAAAAAUL >> shift ) );

    if ( shift > 0 )
    {
      x <<= shift;
      y <<= shift;

      /* re-estimate length for tiny vectors */
      l = x > y ? x + ( y >> 1 )
                : y + ( x >> 1 );
    }
    else
    {
      x >>= -shift;
      y >>= -shift;
      l >>= -shift;
    }

    /* lower linear approximation for reciprocal length minus one */
    b = 0x10000 - (FT_Int32)l;

    x_ = (FT_Int32)x;
    y_ = (FT_Int32)y;

    /* Newton's iterations */
    do
    {
      u = (FT_UInt32)( x_ + ( x_ * b >> 16 ) );
      v = (FT_UInt32)( y_ + ( y_ * b >> 16 ) );

      /* Normalized squared length in the parentheses approaches 2^32. */
      /* On two's complement systems, converting to signed gives the   */
      /* difference with 2^32 even if the expression wraps around.     */
      z = -(FT_Int32)( u * u + v * v ) / 0x200;
      z = z * ( ( 0x10000 + b ) >> 8 ) / 0x10000;

      b += z;

    } while ( z > 0 );

    vector->x = sx < 0 ? -(FT_Pos)u : (FT_Pos)u;
    vector->y = sy < 0 ? -(FT_Pos)v : (FT_Pos)v;

    /* Conversion to signed helps to recover from likely wrap around */
    /* in calculating the prenormalized length, because it gives the */
    /* correct difference with 2^32 on two's complement systems.     */
    l = (FT_UInt32)( 0x10000 + (FT_Int32)( u * x + v * y ) / 0x10000 );
    if ( shift > 0 )
      l = ( l + ( 1 << ( shift - 1 ) ) ) >> shift;
    else
      l <<= -shift;

    return l;
  }